

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.hpp
# Opt level: O2

hugeint_t duckdb::Hugeint::Add<true>(hugeint_t lhs,hugeint_t rhs)

{
  hugeint_t hVar1;
  bool bVar2;
  OutOfRangeException *this;
  hugeint_t rhs_00;
  allocator local_99;
  hugeint_t lhs_local;
  hugeint_t rhs_local;
  string local_78;
  string local_58;
  string local_38;
  
  rhs_00.upper = rhs.upper;
  rhs_local.lower = rhs.lower;
  lhs_local.upper = lhs.upper;
  lhs_local.lower = lhs.lower;
  rhs_00.lower = rhs_00.upper;
  rhs_local.upper = rhs_00.upper;
  bVar2 = TryAddInPlace((Hugeint *)&lhs_local,(hugeint_t *)rhs_local.lower,rhs_00);
  if (bVar2) {
    hVar1.upper = lhs_local.upper;
    hVar1.lower = lhs_local.lower;
    return hVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Overflow in HUGEINT addition: %s + %s",&local_99);
  hugeint_t::ToString_abi_cxx11_(&local_58,&lhs_local);
  hugeint_t::ToString_abi_cxx11_(&local_78,&rhs_local);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_38,&local_58,&local_78);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline static hugeint_t Add(hugeint_t lhs, hugeint_t rhs) {
		if (!TryAddInPlace(lhs, rhs)) {
			throw OutOfRangeException("Overflow in HUGEINT addition: %s + %s", lhs.ToString(), rhs.ToString());
		}
		return lhs;
	}